

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O1

int __thiscall ON_3dVector::IsParallelTo(ON_3dVector *this,ON_3dVector *v,double angle_tolerance)

{
  int iVar1;
  double dVar2;
  double dVar3;
  
  dVar2 = ON_Length3d(this->x,this->y,this->z);
  dVar3 = ON_Length3d(v->x,v->y,v->z);
  iVar1 = 0;
  if (0.0 < dVar3 * dVar2) {
    dVar3 = (this->z * v->z + this->x * v->x + this->y * v->y) / (dVar3 * dVar2);
    dVar2 = cos(angle_tolerance);
    iVar1 = 1;
    if ((dVar3 < dVar2) && (iVar1 = 0, dVar3 <= -dVar2)) {
      iVar1 = -1;
    }
  }
  return iVar1;
}

Assistant:

int ON_3dVector::IsParallelTo( 
      // returns  1: this and other vectors are and parallel
      //         -1: this and other vectors are anti-parallel
      //          0: this and other vectors are not parallel
      //             or at least one of the vectors is zero
      const ON_3dVector& v,
      double angle_tolerance // (default=ON_DEFAULT_ANGLE_TOLERANCE) radians
      ) const
{
  int rc = 0;
  const double ll = Length()*v.Length();
  if ( ll > 0.0 ) {
    const double cos_angle = (x*v.x + y*v.y + z*v.z)/ll;
    const double cos_tol = cos(angle_tolerance);
    if ( cos_angle >= cos_tol )
      rc = 1;
    else if ( cos_angle <= -cos_tol )
      rc = -1;
  }
  return rc;
}